

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall Chainstate::InvalidChainFound(Chainstate *this,CBlockIndex *pindexNew)

{
  pointer ppCVar1;
  bool bVar2;
  int iVar3;
  CBlockIndex *pCVar4;
  ChainstateManager *pCVar5;
  long in_FS_OFFSET;
  double dVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  int *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  string local_90;
  base_blob<256u> local_70 [32];
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = this->m_chainman;
  if (pCVar5->m_best_invalid != (CBlockIndex *)0x0) {
    bVar2 = operator>(&(pindexNew->nChainWork).super_base_uint<256U>,
                      &(pCVar5->m_best_invalid->nChainWork).super_base_uint<256U>);
    pCVar5 = this->m_chainman;
    if (!bVar2) goto LAB_0035eefc;
  }
  pCVar5->m_best_invalid = pindexNew;
LAB_0035eefc:
  if (pCVar5->m_best_header != (CBlockIndex *)0x0) {
    pCVar4 = CBlockIndex::GetAncestor(pCVar5->m_best_header,pindexNew->nHeight);
    if (pCVar4 == pindexNew) {
      ppCVar1 = (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar1 ==
          (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        pCVar4 = (CBlockIndex *)0x0;
      }
      else {
        pCVar4 = ppCVar1[-1];
      }
      this->m_chainman->m_best_header = pCVar4;
    }
  }
  CBlockIndex::GetBlockHash((uint256 *)local_70,pindexNew);
  base_blob<256u>::ToString_abi_cxx11_(&local_50,local_70);
  dVar6 = base_uint<256U>::getdouble(&(pindexNew->nChainWork).super_base_uint<256U>);
  dVar6 = log(dVar6);
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (dVar6 / 0.6931471805599453);
  FormatISO8601DateTime_abi_cxx11_(&local_90,(ulong)pindexNew->nTime);
  logging_function._M_str = "InvalidChainFound";
  logging_function._M_len = 0x11;
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
  source_file._M_len = 0x57;
  LogPrintf_<char[18],std::__cxx11::string,int,double,std::__cxx11::string>
            (logging_function,source_file,0x806,
             I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PRUNE|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|ESTIMATEFEE|
             WALLETDB|BENCH|HTTP|MEMPOOL|NET,(Level)&local_50,(char *)&pindexNew->nHeight,
             (char (*) [18])&stack0xffffffffffffff68,&local_90,in_stack_ffffffffffffff58,
             (double *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),pbVar7);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  ppCVar1 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((ppCVar1 !=
       (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
       _M_impl.super__Vector_impl_data._M_start) &&
     (pCVar4 = ppCVar1[-1], pCVar4 != (CBlockIndex *)0x0)) {
    CBlockIndex::GetBlockHash((uint256 *)local_70,pCVar4);
    base_blob<256u>::ToString_abi_cxx11_(&local_50,local_70);
    iVar3 = (int)((ulong)((long)(this->m_chain).vChain.
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    dVar6 = base_uint<256U>::getdouble(&(pCVar4->nChainWork).super_base_uint<256U>);
    dVar6 = log(dVar6);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (dVar6 / 0.6931471805599453);
    FormatISO8601DateTime_abi_cxx11_(&local_90,(ulong)pCVar4->nTime);
    logging_function_00._M_str = "InvalidChainFound";
    logging_function_00._M_len = 0x11;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file_00._M_len = 0x57;
    LogPrintf_<char[18],std::__cxx11::string,int,double,std::__cxx11::string>
              (logging_function_00,source_file_00,0x80b,
               I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PRUNE|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|ESTIMATEFEE
               |RPC|WALLETDB|MEMPOOL|TOR|NET,(Level)&local_50,&stack0xffffffffffffff64,
               (char (*) [18])&stack0xffffffffffffff68,&local_90,in_stack_ffffffffffffff58,
               (double *)CONCAT44(iVar3,in_stack_ffffffffffffff60),pbVar7);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    CheckForkWarningConditions(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("tip",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                ,0x808,"void Chainstate::InvalidChainFound(CBlockIndex *)");
}

Assistant:

void Chainstate::InvalidChainFound(CBlockIndex* pindexNew)
{
    AssertLockHeld(cs_main);
    if (!m_chainman.m_best_invalid || pindexNew->nChainWork > m_chainman.m_best_invalid->nChainWork) {
        m_chainman.m_best_invalid = pindexNew;
    }
    if (m_chainman.m_best_header != nullptr && m_chainman.m_best_header->GetAncestor(pindexNew->nHeight) == pindexNew) {
        m_chainman.m_best_header = m_chain.Tip();
    }

    LogPrintf("%s: invalid block=%s  height=%d  log2_work=%f  date=%s\n", __func__,
      pindexNew->GetBlockHash().ToString(), pindexNew->nHeight,
      log(pindexNew->nChainWork.getdouble())/log(2.0), FormatISO8601DateTime(pindexNew->GetBlockTime()));
    CBlockIndex *tip = m_chain.Tip();
    assert (tip);
    LogPrintf("%s:  current best=%s  height=%d  log2_work=%f  date=%s\n", __func__,
      tip->GetBlockHash().ToString(), m_chain.Height(), log(tip->nChainWork.getdouble())/log(2.0),
      FormatISO8601DateTime(tip->GetBlockTime()));
    CheckForkWarningConditions();
}